

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::text::text(text *this,string *type)

{
  base_widget::base_widget((base_widget *)&(this->super_base_html_input).field_0x88);
  base_html_input::base_html_input
            (&this->super_base_html_input,&PTR_construction_vtable_24__002b4a18,type);
  base_text::base_text
            ((base_text *)&(this->super_base_html_input).field_0x30,
             &PTR_construction_vtable_24__002b4a28);
  (this->super_base_html_input)._vptr_base_html_input = (_func_int **)0x2b4908;
  *(undefined8 *)&(this->super_base_html_input).field_0x88 = 0x2b49c0;
  *(undefined8 *)&(this->super_base_html_input).field_0x30 = 0x2b4948;
  *(undefined4 *)&(this->super_base_html_input).field_0x78 = 0xffffffff;
  *(undefined8 *)&(this->super_base_html_input).field_0x80 = 0;
  return;
}

Assistant:

text::text(std::string const &type): base_html_input(type), size_(-1) {}